

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O1

void __thiscall
duckdb::MultiFileOptions::AutoDetectHivePartitioning
          (MultiFileOptions *this,MultiFileList *files,ClientContext *context)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  InvalidInputException *this_00;
  byte bVar4;
  string local_40;
  
  iVar3 = (*files->_vptr_MultiFileList[5])(files);
  if ((char)iVar3 != '\0') {
    bVar4 = this->auto_detect_hive_partitioning | this->hive_partitioning;
    sVar1 = (this->hive_types_schema)._M_h._M_element_count;
    if (sVar1 != 0 && (bVar4 & 1) == 0) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"cannot disable hive_partitioning when hive_types is enabled",
                 "");
      InvalidInputException::InvalidInputException(this_00,&local_40);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((~this->auto_detect_hive_partitioning | this->hive_partitioning) & 1U) == 0 && sVar1 != 0)
    {
      this->hive_partitioning = true;
      this->auto_detect_hive_partitioning = false;
    }
    if (this->auto_detect_hive_partitioning == true) {
      bVar2 = AutoDetectHivePartitioningInternal
                        (files,(ClientContext *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar4));
      this->hive_partitioning = bVar2;
    }
    if ((this->hive_partitioning == true) && (this->hive_types_autocast == true)) {
      AutoDetectHiveTypesInternal(this,files,context);
      return;
    }
  }
  return;
}

Assistant:

void MultiFileOptions::AutoDetectHivePartitioning(MultiFileList &files, ClientContext &context) {
	if (files.GetExpandResult() == FileExpandResult::NO_FILES) {
		return;
	}
	const bool hp_explicitly_disabled = !auto_detect_hive_partitioning && !hive_partitioning;
	const bool ht_enabled = !hive_types_schema.empty();
	if (hp_explicitly_disabled && ht_enabled) {
		throw InvalidInputException("cannot disable hive_partitioning when hive_types is enabled");
	}
	if (ht_enabled && auto_detect_hive_partitioning && !hive_partitioning) {
		// hive_types flag implies hive_partitioning
		hive_partitioning = true;
		auto_detect_hive_partitioning = false;
	}
	if (auto_detect_hive_partitioning) {
		hive_partitioning = AutoDetectHivePartitioningInternal(files, context);
	}
	if (hive_partitioning && hive_types_autocast) {
		AutoDetectHiveTypesInternal(files, context);
	}
}